

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

bool cmLocalGeneratorCheckObjectName(string *objName,size_type dir_len,size_type max_total_len)

{
  long lVar1;
  cmCryptoHash md5;
  string md5name;
  string local_70;
  cmCryptoHash local_50;
  string local_40;
  
  if (dir_len < max_total_len) {
    if (objName->_M_string_length <= max_total_len - dir_len) {
      return true;
    }
    lVar1 = std::__cxx11::string::find((char)objName,0x2f);
    if (lVar1 != -1) {
      cmCryptoHash::cmCryptoHash(&local_50,AlgoMD5);
      std::__cxx11::string::substr((ulong)&local_70,(ulong)objName);
      cmCryptoHash::HashString(&local_40,&local_50,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::substr((ulong)&local_70,(ulong)objName);
      std::__cxx11::string::_M_append((char *)&local_40,(ulong)local_70._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_assign((string *)objName);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      cmCryptoHash::~cmCryptoHash(&local_50);
      return true;
    }
  }
  return false;
}

Assistant:

bool cmLocalGeneratorCheckObjectName(std::string& objName,
                                     std::string::size_type dir_len,
                                     std::string::size_type max_total_len)
{
  // Enforce the maximum file name length if possible.
  std::string::size_type max_obj_len = max_total_len;
  if (dir_len < max_total_len) {
    max_obj_len = max_total_len - dir_len;
    if (objName.size() > max_obj_len) {
      // The current object file name is too long.  Try to shorten it.
      return cmLocalGeneratorShortenObjectName(objName, max_obj_len);
    }
    // The object file name is short enough.
    return true;
  }
  // The build directory in which the object will be stored is
  // already too deep.
  return false;
}